

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_io_primitive_print
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  size_t __size;
  size_t i;
  ulong uVar5;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar4 = *arguments;
  if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
    uVar4 = (ulong)(*(uint *)(uVar4 + 0xc) >> 3);
  }
  else {
    uVar4 = 0;
  }
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = *arguments;
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      sVar3 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
    }
    else {
      sVar3 = 0;
    }
    sVar3 = sysbvm_tuple_asString(context,sVar3);
    _Var2 = sysbvm_tuple_isBytes(sVar3);
    if (!_Var2) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/io.c:152: assertion failure: sysbvm_tuple_isBytes(string)"
                );
    }
    if ((sVar3 & 0xf) == 0 && sVar3 != 0) {
      __size = (size_t)*(uint *)(sVar3 + 0xc);
    }
    else {
      __size = 0;
    }
    fwrite((void *)(sVar3 + 0x10),__size,1,_stdout);
  }
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_io_primitive_print(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    size_t parameterCount = sysbvm_array_getSize(arguments[0]);
    for(size_t i = 0; i < parameterCount; ++i)
    {
        sysbvm_tuple_t string = sysbvm_tuple_asString(context, sysbvm_array_at(arguments[0], i));
        SYSBVM_ASSERT(sysbvm_tuple_isBytes(string));
        fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, sysbvm_tuple_getSizeInBytes(string), 1, stdout);

    }

    return SYSBVM_VOID_TUPLE;
}